

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  int iVar1;
  int local_38;
  int local_34;
  int n;
  int addr1;
  int iOffset;
  int iLimit;
  Vdbe *v;
  Select *pSStack_18;
  int iBreak_local;
  Select *p_local;
  Parse *pParse_local;
  
  _iOffset = (Vdbe *)0x0;
  addr1 = 0;
  if ((p->iLimit == 0) &&
     (v._4_4_ = iBreak, pSStack_18 = p, p_local = (Select *)pParse, sqlite3ExprCacheClear(pParse),
     pSStack_18->pLimit != (Expr *)0x0)) {
    addr1 = *(int *)&p_local->pNext + 1;
    *(int *)&p_local->pNext = addr1;
    pSStack_18->iLimit = addr1;
    _iOffset = sqlite3GetVdbe((Parse *)p_local);
    if (_iOffset != (Vdbe *)0x0) {
      iVar1 = sqlite3ExprIsInteger(pSStack_18->pLimit,&local_38);
      if (iVar1 == 0) {
        sqlite3ExprCode((Parse *)p_local,pSStack_18->pLimit,addr1);
        sqlite3VdbeAddOp1(_iOffset,0x15,addr1);
        sqlite3VdbeAddOp2(_iOffset,0x7a,addr1,v._4_4_);
      }
      else {
        sqlite3VdbeAddOp2(_iOffset,7,local_38,addr1);
        if (local_38 == 0) {
          sqlite3VdbeAddOp2(_iOffset,1,0,v._4_4_);
        }
        else if ((double)local_38 < pSStack_18->nSelectRow) {
          pSStack_18->nSelectRow = (double)local_38;
        }
      }
      if (pSStack_18->pOffset != (Expr *)0x0) {
        n = *(int *)&p_local->pNext + 1;
        *(int *)&p_local->pNext = n;
        pSStack_18->iOffset = n;
        *(int *)&p_local->pNext = *(int *)&p_local->pNext + 1;
        sqlite3ExprCode((Parse *)p_local,pSStack_18->pOffset,n);
        sqlite3VdbeAddOp1(_iOffset,0x15,n);
        local_34 = sqlite3VdbeAddOp1(_iOffset,0x78,n);
        sqlite3VdbeAddOp2(_iOffset,7,0,n);
        sqlite3VdbeJumpHere(_iOffset,local_34);
        sqlite3VdbeAddOp3(_iOffset,0x56,addr1,n,n + 1);
        local_34 = sqlite3VdbeAddOp1(_iOffset,0x78,addr1);
        sqlite3VdbeAddOp2(_iOffset,7,-1,n + 1);
        sqlite3VdbeJumpHere(_iOffset,local_34);
      }
    }
  }
  return;
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int addr1, n;
  if( p->iLimit ) return;

  /* 
  ** "LIMIT -1" always shows all rows.  There is some
  ** contraversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  sqlite3ExprCacheClear(pParse);
  assert( p->pOffset==0 || p->pLimit!=0 );
  if( p->pLimit ){
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;  /* VDBE should have already been allocated */
    if( sqlite3ExprIsInteger(p->pLimit, &n) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeAddOp2(v, OP_Goto, 0, iBreak);
      }else{
        if( p->nSelectRow > (double)n ) p->nSelectRow = (double)n;
      }
    }else{
      sqlite3ExprCode(pParse, p->pLimit, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfZero, iLimit, iBreak);
    }
    if( p->pOffset ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, p->pOffset, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset);
      VdbeComment((v, "OFFSET counter"));
      addr1 = sqlite3VdbeAddOp1(v, OP_IfPos, iOffset);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, iOffset);
      sqlite3VdbeJumpHere(v, addr1);
      sqlite3VdbeAddOp3(v, OP_Add, iLimit, iOffset, iOffset+1);
      VdbeComment((v, "LIMIT+OFFSET"));
      addr1 = sqlite3VdbeAddOp1(v, OP_IfPos, iLimit);
      sqlite3VdbeAddOp2(v, OP_Integer, -1, iOffset+1);
      sqlite3VdbeJumpHere(v, addr1);
    }
  }
}